

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O2

string * __thiscall
el::base::TypedConfigurations::resolveFilename
          (string *__return_storage_ptr__,TypedConfigurations *this,string *filename)

{
  char cVar1;
  pointer pcVar2;
  ulong uVar3;
  MillisecondsWidth *in_RCX;
  char *pcVar4;
  long lVar5;
  string dateTimeFormatSpecifierStr;
  string fmt;
  MillisecondsWidth msWidth;
  string now;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)filename);
  std::__cxx11::string::string((string *)&dateTimeFormatSpecifierStr,"%datetime",(allocator *)&now);
  uVar3 = std::__cxx11::string::find
                    ((char *)__return_storage_ptr__,
                     (ulong)dateTimeFormatSpecifierStr._M_dataplus._M_p);
  if (uVar3 != 0xffffffffffffffff) {
    while (pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p, uVar3 != 0) {
      if (pcVar2[uVar3 - 1] != '%') {
        if (uVar3 == 0xffffffffffffffff) goto LAB_001242e3;
        break;
      }
      uVar3 = std::__cxx11::string::find
                        ((char *)__return_storage_ptr__,
                         (ulong)dateTimeFormatSpecifierStr._M_dataplus._M_p);
    }
    pcVar4 = pcVar2 + dateTimeFormatSpecifierStr._M_string_length + uVar3;
    fmt._M_dataplus._M_p = (pointer)&fmt.field_2;
    fmt._M_string_length = 0;
    fmt.field_2._M_local_buf[0] = '\0';
    if ((uVar3 < __return_storage_ptr__->_M_string_length) && (*pcVar4 == '{')) {
      std::__cxx11::stringstream::stringstream((stringstream *)&now);
      for (lVar5 = 1; (cVar1 = pcVar4[lVar5], cVar1 != '\0' && (cVar1 != '}')); lVar5 = lVar5 + 1) {
        std::operator<<((ostream *)now.field_2._M_local_buf,cVar1);
      }
      std::__cxx11::string::erase
                ((ulong)__return_storage_ptr__,uVar3 + dateTimeFormatSpecifierStr._M_string_length);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)&fmt,(string *)&msWidth);
      std::__cxx11::string::~string((string *)&msWidth);
      std::__cxx11::stringstream::~stringstream((stringstream *)&now);
    }
    else {
      std::__cxx11::string::string((string *)&now,"%Y-%M-%d_%H-%m",(allocator *)&msWidth);
      std::__cxx11::string::operator=((string *)&fmt,(string *)&now);
      std::__cxx11::string::~string((string *)&now);
    }
    msWidth.m_width = 3;
    msWidth.m_offset = 1000;
    utils::DateTime::getDateTime_abi_cxx11_
              (&now,(DateTime *)fmt._M_dataplus._M_p,(char *)&msWidth,in_RCX);
    utils::Str::replaceAll(&now,'/','-');
    utils::Str::replaceAll(__return_storage_ptr__,&dateTimeFormatSpecifierStr,&now);
    std::__cxx11::string::~string((string *)&now);
    std::__cxx11::string::~string((string *)&fmt);
  }
LAB_001242e3:
  std::__cxx11::string::~string((string *)&dateTimeFormatSpecifierStr);
  return __return_storage_ptr__;
}

Assistant:

std::string resolveFilename(const std::string& filename) {
        std::string resultingFilename = filename;
        std::size_t dateIndex = std::string::npos;
        std::string dateTimeFormatSpecifierStr = std::string(base::consts::kDateTimeFormatSpecifierForFilename);
        if ((dateIndex = resultingFilename.find(dateTimeFormatSpecifierStr.c_str())) != std::string::npos) {
            while (dateIndex > 0 && resultingFilename[dateIndex - 1] == base::consts::kFormatSpecifierChar) {
                dateIndex = resultingFilename.find(dateTimeFormatSpecifierStr.c_str(), dateIndex + 1);
            }
            if (dateIndex != std::string::npos) {
                const char* ptr = resultingFilename.c_str() + dateIndex;
                // Goto end of specifier
                ptr += dateTimeFormatSpecifierStr.size();
                std::string fmt;
                if ((resultingFilename.size() > dateIndex) && (ptr[0] == '{')) {
                    // User has provided format for date/time
                    ++ptr;
                    int count = 1;  // Start by 1 in order to remove starting brace
                    std::stringstream ss;
                    for (; *ptr; ++ptr, ++count) {
                        if (*ptr == '}') {
                            ++count;  // In order to remove ending brace
                            break;
                        }
                        ss << *ptr;
                    }
                    resultingFilename.erase(dateIndex + dateTimeFormatSpecifierStr.size(), count);
                    fmt = ss.str();
                } else {
                    fmt = std::string(base::consts::kDefaultDateTimeFormatInFilename);
                }
                base::MillisecondsWidth msWidth(3);
                std::string now = base::utils::DateTime::getDateTime(fmt.c_str(), &msWidth);
                base::utils::Str::replaceAll(now, '/', '-'); // Replace path element since we are dealing with filename
                base::utils::Str::replaceAll(resultingFilename, dateTimeFormatSpecifierStr, now);
            }
        }
        return resultingFilename;
    }